

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# home.cpp
# Opt level: O2

string * fs_expanduser_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  _Bool _Var1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  allocator<char> local_a1;
  string_view path_local;
  string home;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar3 = path._M_str;
  path_local._M_len = path._M_len;
  if (path_local._M_len == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    path_local._M_str = pcVar3;
    if ((*pcVar3 == '~') &&
       (((path_local._M_len == 1 || (pcVar3[1] == '/')) ||
        ((_Var1 = fs_is_windows(), _Var1 && (pcVar3[1] == '\\')))))) {
      fs_get_homedir_abi_cxx11_();
      if (home._M_string_length == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      }
      else if (path_local._M_len < 3) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)home._M_dataplus._M_p == &home.field_2) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(home.field_2._M_allocated_capacity._1_7_,home.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = home.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = home._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(home.field_2._M_allocated_capacity._1_7_,home.field_2._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = home._M_string_length;
        home._M_string_length = 0;
        home.field_2._M_local_buf[0] = '\0';
        home._M_dataplus._M_p = (pointer)&home.field_2;
      }
      else {
        uVar2 = path_local._M_len;
        for (uVar4 = 2;
            (uVar4 < uVar2 &&
            ((path_local._M_str[uVar4] == '/' ||
             ((_Var1 = fs_is_windows(), _Var1 &&
              (uVar2 = path_local._M_len, path_local._M_str[uVar4] == '\\')))))); uVar4 = uVar4 + 1)
        {
        }
        std::operator+(&local_30,&home,"/");
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  (local_70,&path_local,&local_a1);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)local_70);
        std::operator+(__return_storage_ptr__,&local_30,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string((string *)&local_30);
        if ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1]
            == '/') {
          std::__cxx11::string::pop_back();
        }
      }
      std::__cxx11::string::~string((string *)&home);
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,&path_local,(allocator<char> *)&home);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_expanduser(std::string_view path)
{
  if(path.empty()) FFS_UNLIKELY
    return {};

  if(path.front() != '~')
    return std::string(path);

  // second character is not a file separator
  // std::set is much slower than a simple if
  if(path.length() > 1 && !(path[1] == '/' || (fs_is_windows() && path[1] == '\\')))
    return std::string(path);

  std::string home = fs_get_homedir();
  if(home.empty()) FFS_UNLIKELY
    return {};

  if (path.length() < 3)
    return home;

// handle initial duplicated file separators. NOT .lexical_normal to handle "~/.."
// std::set is much slower than a simple if
  std::string::size_type i = 2;
  while(i < path.length() && (path[i] == '/' || (fs_is_windows() && path[i] == '\\')))
    i++;

  std::string e = home + "/" + std::string(path).substr(i);

  if (e.back() == '/')
    e.pop_back();

  return e;
}